

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestValidate.c
# Opt level: O2

void RDL_validate(RDL_data *data,RDL_DimacsGraph *dimacs_graph,int timeout,int *urf_result,
                 int *basis_result)

{
  RDL_data *pRVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char **cycle_array_00;
  uint *family_numbers;
  undefined4 extraout_var;
  char **cycles;
  char *__dest;
  uint *bcc;
  void *__ptr;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  ulong uVar9;
  RDL_cycle **cycle_array;
  int timeout_local;
  RDL_data *local_70;
  int *local_68;
  ulong local_60;
  ulong local_58;
  size_t local_50;
  int *local_48;
  char **basis_cycle_array;
  char **other_cycle_array;
  
  *urf_result = 0;
  *basis_result = 0;
  timeout_local = timeout;
  local_68 = urf_result;
  local_48 = basis_result;
  uVar2 = RDL_getRCycles(data,&cycle_array);
  RDL_deleteCycles(cycle_array,uVar2);
  uVar6 = (ulong)uVar2;
  local_50 = uVar6 * 8;
  cycle_array_00 = (char **)malloc(local_50);
  local_58 = uVar6;
  family_numbers = (uint *)malloc(uVar6 * 4);
  uVar2 = RDL_getNofURF(data);
  local_70 = data;
  uVar3 = RDL_getNofEdges(data);
  local_60 = CONCAT44(extraout_var,uVar3);
  uVar6 = 0;
  for (uVar3 = 0; pRVar1 = local_70, uVar3 != uVar2; uVar3 = uVar3 + 1) {
    uVar4 = RDL_getRCyclesForURF(local_70,uVar3,&cycle_array);
    uVar4 = RDL_translateCycArray(pRVar1,cycle_array,uVar4,&other_cycle_array);
    RDL_deleteCycles(cycle_array,uVar4);
    for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
      uVar7 = uVar6 + uVar9 & 0xffffffff;
      cycle_array_00[uVar7] = other_cycle_array[uVar9];
      family_numbers[uVar7] = uVar3;
    }
    free(other_cycle_array);
    uVar6 = (ulong)(uint)((int)uVar6 + (int)uVar9);
  }
  cycles = (char **)malloc(local_50);
  iVar5 = (int)local_60;
  uVar6 = local_60 & 0xffffffff;
  for (uVar9 = 0; uVar7 = local_58, local_58 != uVar9; uVar9 = uVar9 + 1) {
    __dest = (char *)malloc((ulong)(iVar5 + 1));
    cycles[uVar9] = __dest;
    memcpy(__dest,cycle_array_00[uVar9],uVar6);
    __dest[uVar6] = '\x02';
  }
  qsort(cycles,local_58,8,RDL_cmp_cycles);
  if (dimacs_graph->nof_cycles == 0xffffffff) {
    fwrite("skipping RC test, no RCs in input file...\n",0x2a,1,_stderr);
LAB_00103bd3:
    piVar8 = local_68;
    if (*local_68 != 0) goto LAB_00103c28;
    RDL_timeout_stop_fun(&timeout_local);
    iVar5 = RDL_validateRingFamilies
                      (cycle_array_00,family_numbers,(uint)uVar7,(uint)local_60,RDL_timeout_stop_fun
                      );
  }
  else {
    if ((uint)uVar7 == dimacs_graph->nof_cycles) {
      uVar9 = 0;
      do {
        if (uVar7 == uVar9) goto LAB_00103bd3;
        iVar5 = bcmp(cycles[uVar9],dimacs_graph->sorted_cycles[uVar9],uVar6);
        uVar9 = uVar9 + 1;
      } while (iVar5 == 0);
      fwrite("relevant cycle mismatch found!\n",0x1f,1,_stderr);
    }
    else {
      fprintf(_stderr,"different number of relevant cycles %u vs %u!\n",uVar7 & 0xffffffff);
    }
    iVar5 = 1;
    piVar8 = local_68;
  }
  *piVar8 = iVar5;
LAB_00103c28:
  pRVar1 = local_70;
  uVar2 = RDL_getSSSR(local_70,&cycle_array);
  bcc = (uint *)malloc((ulong)uVar2 * 4);
  uVar9 = (ulong)pRVar1->bccGraphs->nof_bcc;
  __ptr = malloc(uVar9 * 4);
  pRVar1 = local_70;
  for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    *(undefined4 *)((long)__ptr + uVar6 * 4) = 0;
  }
  for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
    uVar3 = RDL_getEdgeId(pRVar1,(*cycle_array[uVar6]->edges)[0],(*cycle_array[uVar6]->edges)[1]);
    uVar3 = *pRVar1->bccGraphs->edge_to_bcc_mapping[uVar3];
    bcc[uVar6] = uVar3;
    piVar8 = (int *)((long)__ptr + (ulong)uVar3 * 4);
    *piVar8 = *piVar8 + 1;
  }
  RDL_translateCycArray(local_70,cycle_array,uVar2,&basis_cycle_array);
  RDL_deleteCycles(cycle_array,uVar2);
  RDL_timeout_stop_fun(&timeout_local);
  uVar3 = (uint)local_58;
  iVar5 = RDL_validateBasis(cycle_array_00,uVar3,basis_cycle_array,uVar2,(uint)local_60,bcc,
                            RDL_timeout_stop_fun);
  *local_48 = iVar5;
  free(bcc);
  free(family_numbers);
  free(__ptr);
  RDL_deleteEdgeIdxArray(cycle_array_00,uVar3);
  RDL_deleteEdgeIdxArray(basis_cycle_array,uVar2);
  RDL_deleteEdgeIdxArray(cycles,uVar3);
  return;
}

Assistant:

void RDL_validate(RDL_data* data, RDL_DimacsGraph* dimacs_graph, int timeout,
                  int* urf_result, int* basis_result)
{
  unsigned URFcount, idx, weight, nof_relevant, curr_bcc,
    running_idx, idx2, nof_edges, nof_basis, edge, max_nof_basis_bcc=0;
  RDL_cycle **cycle_array;
  char **other_cycle_array, **final_cycle_array, **sortable_cycle_array, **basis_cycle_array;
  unsigned *urf_numbers, *bcc, *nof_basis_bcc;

  *urf_result = 0;
  *basis_result = 0;

  nof_relevant = RDL_getRCycles(data, &cycle_array);
  RDL_deleteCycles(cycle_array, nof_relevant);

  final_cycle_array = malloc(nof_relevant * sizeof(*final_cycle_array));
  urf_numbers = malloc(nof_relevant * sizeof(*urf_numbers));

  URFcount = RDL_getNofURF(data);

  nof_edges = RDL_getNofEdges(data);

  for (idx = 0, running_idx = 0; idx < URFcount; ++idx) {
    weight = RDL_getRCyclesForURF(data, idx,  &cycle_array);
    weight = RDL_translateCycArray(data, cycle_array, weight, &other_cycle_array);
    RDL_deleteCycles(cycle_array, weight);

    for (idx2 = 0; idx2 < weight; ++idx2, ++running_idx) {
      final_cycle_array[running_idx] = other_cycle_array[idx2];
      urf_numbers[running_idx] = idx;

    }

    free(other_cycle_array);
  }


  sortable_cycle_array = malloc(nof_relevant * sizeof(*sortable_cycle_array));
  for (idx = 0; idx < nof_relevant; ++idx) {
    sortable_cycle_array[idx] = malloc((nof_edges + 1) * sizeof(**sortable_cycle_array));
    memcpy(sortable_cycle_array[idx], final_cycle_array[idx], nof_edges * sizeof(**sortable_cycle_array));
    sortable_cycle_array[idx][nof_edges] = 2;
  }

  qsort(sortable_cycle_array, nof_relevant, sizeof(*sortable_cycle_array), RDL_cmp_cycles);

  if (dimacs_graph->nof_cycles == UINT_MAX) {
    fprintf(stderr, "skipping RC test, no RCs in input file...\n");
  }
  else if (nof_relevant != dimacs_graph->nof_cycles) {
    fprintf(stderr, "different number of relevant cycles %u vs %u!\n",
        nof_relevant, dimacs_graph->nof_cycles);
    *urf_result = 1;
  }
  else {
    for (idx = 0; idx < nof_relevant; ++idx) {
      if (memcmp(sortable_cycle_array[idx], dimacs_graph->sorted_cycles[idx],
          nof_edges * sizeof(**sortable_cycle_array))) {
        fprintf(stderr, "relevant cycle mismatch found!\n");
        *urf_result = 1;
        break;
      }
    }
  }

  if (!*urf_result) {
    RDL_timeout_stop_fun(&timeout);

    *urf_result = RDL_validateRingFamilies((const char**)final_cycle_array, urf_numbers,
        nof_relevant, nof_edges, RDL_timeout_stop_fun);
  }

  nof_basis = RDL_getSSSR(data, &cycle_array);

  bcc = malloc(nof_basis * sizeof(*bcc));
  nof_basis_bcc = malloc(data->bccGraphs->nof_bcc * sizeof(*nof_basis_bcc));
  for (idx = 0; idx < data->bccGraphs->nof_bcc; ++idx) {
    nof_basis_bcc[idx] = 0;
  }
  for (idx = 0; idx < nof_basis; ++idx) {
    edge = RDL_getEdgeId(data, cycle_array[idx]->edges[0][0],
        cycle_array[idx]->edges[0][1]);
    curr_bcc = data->bccGraphs->edge_to_bcc_mapping[edge][0];
    bcc[idx] = curr_bcc;
    ++nof_basis_bcc[curr_bcc];
    max_nof_basis_bcc = nof_basis_bcc[curr_bcc] > max_nof_basis_bcc ? nof_basis_bcc[curr_bcc] : max_nof_basis_bcc;
  }

  RDL_translateCycArray(data, cycle_array, nof_basis, &basis_cycle_array);
  RDL_deleteCycles(cycle_array, nof_basis);

  RDL_timeout_stop_fun(&timeout);
  *basis_result = RDL_validateBasis(
      (const char**)final_cycle_array, nof_relevant,
      (const char**)basis_cycle_array, nof_basis,
      nof_edges, bcc, RDL_timeout_stop_fun);
  free(bcc);
  free(urf_numbers);
  free(nof_basis_bcc);

  RDL_deleteEdgeIdxArray(final_cycle_array, nof_relevant);
  RDL_deleteEdgeIdxArray(basis_cycle_array, nof_basis);
  RDL_deleteEdgeIdxArray(sortable_cycle_array, nof_relevant);
}